

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O0

_Bool prepare_ghost(chunk *c,wchar_t r_idx,monster *mon,_Bool from_savefile)

{
  ghost_info *pgVar1;
  _Bool _Var2;
  uint32_t uVar3;
  int iVar4;
  monster_race *pmVar5;
  monster_lore_conflict *pmVar6;
  monster_blow *pmVar7;
  char *pcVar8;
  char *pcVar9;
  size_t sVar10;
  ushort **ppuVar11;
  player_race *p_race_00;
  player_class *class_00;
  bool bVar12;
  monster_blow *local_4c0;
  char local_4b8 [2];
  char acStack_4b6 [6];
  char buf [80];
  char path [1024];
  ang_file *local_60;
  ang_file *fp;
  player_class *class;
  player_race *p_race;
  monster_lore *lore;
  monster_race *race;
  uint16_t iblow;
  uint8_t i;
  uint8_t try;
  wchar_t ghost_class;
  wchar_t ghost_race;
  _Bool from_savefile_local;
  monster *mon_local;
  chunk *pcStack_18;
  wchar_t r_idx_local;
  chunk *c_local;
  
  race._4_4_ = 0;
  pmVar5 = r_info + r_idx;
  ghost_class._3_1_ = from_savefile;
  _ghost_race = mon;
  mon_local._4_4_ = r_idx;
  pcStack_18 = c;
  pmVar6 = get_lore(pmVar5);
  local_60 = (ang_file *)0x0;
  if (pcStack_18->ghost == (ghost_info *)0x0) {
    __assert_fail("c->ghost",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-make.c"
                  ,0x2d7,"_Bool prepare_ghost(struct chunk *, int, struct monster *, _Bool)");
  }
  _Var2 = flag_has_dbg(pmVar5->flags,0xc,2,"race->flags","RF_PLAYER_GHOST");
  if (_Var2) {
    if ((pmVar5->level < pcStack_18->depth + L'\xfffffffb') && ((ghost_class._3_1_ & 1) == 0)) {
      c_local._7_1_ = false;
    }
    else {
      pcStack_18->ghost->race = mon_local._4_4_;
      mem_free(r_info[(int)(z_info->r_max - 1)].blow);
      memcpy(r_info + (int)(z_info->r_max - 1),pmVar5,0xd0);
      pmVar7 = (monster_blow *)mem_alloc((ulong)z_info->mon_blows_max * 0x30);
      r_info[(int)(z_info->r_max - 1)].blow = pmVar7;
      for (race._0_2_ = 0; (ushort)race < z_info->mon_blows_max; race._0_2_ = (ushort)race + 1) {
        memcpy(r_info[(int)(z_info->r_max - 1)].blow + (ushort)race,pmVar5->blow + (ushort)race,0x30
              );
        if ((int)(uint)(ushort)race < (int)(z_info->mon_blows_max - 1)) {
          local_4c0 = r_info[(int)(z_info->r_max - 1)].blow + (long)(int)(uint)(ushort)race + 1;
        }
        else {
          local_4c0 = (monster_blow *)0x0;
        }
        r_info[(int)(z_info->r_max - 1)].blow[(ushort)race].next = local_4c0;
      }
      pmVar5 = r_info + (int)(z_info->r_max - 1);
      _ghost_race->race = pmVar5;
      pmVar5->rarity = L'\0';
      for (race._3_1_ = 0; pcVar9 = ANGBAND_DIR_BONE, race._3_1_ < 0x28; race._3_1_ = race._3_1_ + 1
          ) {
        if (race._3_1_ == 0) {
          if (pcStack_18->ghost->bones_selector == L'\0') {
            pcStack_18->ghost->bones_selector = (int)player->depth;
            pcVar9 = ANGBAND_DIR_BONE;
            pcVar8 = format("bone.%03d",(ulong)(uint)pcStack_18->ghost->bones_selector);
            path_build(buf + 0x48,0x400,pcVar9,pcVar8);
          }
          else if ((pcStack_18->ghost->bones_selector & 0x80U) == 0) {
            pcVar8 = format("bone.%03d",(ulong)(uint)pcStack_18->ghost->bones_selector);
            path_build(buf + 0x48,0x400,pcVar9,pcVar8);
          }
          else {
            pcStack_18->ghost->bones_selector = pcStack_18->ghost->bones_selector & 0x7f;
            pcVar9 = ANGBAND_DIR_GHOST;
            pcVar8 = format("bone.%03d",(ulong)(uint)pcStack_18->ghost->bones_selector);
            path_build(buf + 0x48,0x400,pcVar9,pcVar8);
            pcStack_18->ghost->bones_selector = pcStack_18->ghost->bones_selector | 0x80;
          }
        }
        else {
          uVar3 = Rand_div(z_info->max_depth - 1);
          pcStack_18->ghost->bones_selector = uVar3 + L'\x01';
          uVar3 = Rand_div(3);
          pcVar8 = ANGBAND_DIR_GHOST;
          pcVar9 = ANGBAND_DIR_BONE;
          if (uVar3 == 0) {
            pcVar9 = format("bone.%03d",(ulong)(uint)pcStack_18->ghost->bones_selector);
            path_build(buf + 0x48,0x400,pcVar8,pcVar9);
            pcStack_18->ghost->bones_selector = pcStack_18->ghost->bones_selector | 0x80;
          }
          else {
            pcVar8 = format("bone.%03d",(ulong)(uint)pcStack_18->ghost->bones_selector);
            path_build(buf + 0x48,0x400,pcVar9,pcVar8);
          }
        }
        sVar10 = strlen(buf + 0x48);
        if (sVar10 != 0) {
          local_60 = file_open(buf + 0x48,MODE_READ,FTYPE_TEXT);
          if (local_60 == (ang_file *)0x0) {
            pcStack_18->ghost->bones_selector = L'\0';
          }
          else if (local_60 != (ang_file *)0x0) break;
        }
      }
      if (local_60 == (ang_file *)0x0) {
        c_local._7_1_ = false;
      }
      else {
        _Var2 = file_getl(local_60,local_4b8,0x50);
        if (_Var2) {
          my_strcpy(pcStack_18->ghost->name,local_4b8,0xf);
          _Var2 = file_getl(local_60,local_4b8,0x50);
          if (_Var2) {
            iVar4 = __isoc99_sscanf(local_4b8,"%d",&iblow);
            if (iVar4 == 1) {
              _Var2 = file_getl(local_60,local_4b8,0x50);
              if (_Var2) {
                iVar4 = __isoc99_sscanf(local_4b8,"%d",(long)&race + 4);
                if (iVar4 == 1) {
                  _Var2 = file_getl(local_60,local_4b8,0x50);
                  if ((_Var2) &&
                     (iVar4 = __isoc99_sscanf(local_4b8,"%d",&pcStack_18->ghost->string_type),
                     iVar4 != 1)) {
                    pcStack_18->ghost->string_type = L'\0';
                  }
                  sVar10 = strlen(local_4b8);
                  if (sVar10 < 3) {
                    pcStack_18->ghost->string_type = L'\0';
                  }
                  else {
                    pgVar1 = pcStack_18->ghost;
                    sVar10 = strlen(local_4b8);
                    my_strcpy(pgVar1->string,acStack_4b6,sVar10);
                  }
                  file_close(local_60);
                  race._2_1_ = 0;
                  while( true ) {
                    bVar12 = false;
                    if ((race._2_1_ < 0x10) &&
                       (bVar12 = false, pcStack_18->ghost->name[race._2_1_] != '\0')) {
                      bVar12 = pcStack_18->ghost->name[race._2_1_] != ',';
                    }
                    if (!bVar12) break;
                    race._2_1_ = race._2_1_ + 1;
                  }
                  pcStack_18->ghost->name[race._2_1_] = '\0';
                  if (pcStack_18->ghost->name[0] == '\0') {
                    pgVar1 = pcStack_18->ghost;
                    sVar10 = strlen(pcStack_18->ghost->name);
                    my_strcpy(pgVar1->name,"Nobody",sVar10);
                  }
                  ppuVar11 = __ctype_b_loc();
                  if (((*ppuVar11)[(int)pcStack_18->ghost->name[0]] & 0x200) != 0) {
                    iVar4 = toupper((int)pcStack_18->ghost->name[0]);
                    pcStack_18->ghost->name[0] = (char)iVar4;
                  }
                  p_race_00 = player_id2race(_iblow);
                  class_00 = player_id2class(race._4_4_);
                  process_ghost_race_class(p_race_00,class_00,pmVar5);
                  if (L'K' < pcStack_18->depth) {
                    pmVar5->spell_power =
                         ((pcStack_18->depth + L'\xffffffb5') * 3) / 2 + pmVar5->spell_power;
                  }
                  add_to_monster_rating(pcStack_18,10);
                  pmVar6->sights = 1;
                  c_local._7_1_ = true;
                }
                else {
                  c_local._7_1_ = false;
                }
              }
              else {
                c_local._7_1_ = false;
              }
            }
            else {
              c_local._7_1_ = false;
            }
          }
          else {
            c_local._7_1_ = false;
          }
        }
        else {
          c_local._7_1_ = false;
        }
      }
    }
  }
  else {
    c_local._7_1_ = false;
  }
  return c_local._7_1_;
}

Assistant:

bool prepare_ghost(struct chunk *c, int r_idx, struct monster *mon,
				   bool from_savefile)
{
	int ghost_race, ghost_class = 0;
	uint8_t try, i;
	uint16_t iblow;

	struct monster_race *race = &r_info[r_idx];
	struct monster_lore *lore = get_lore(race);
	struct player_race *p_race;
	struct player_class *class;

	ang_file *fp = NULL;
	char path[1024];
	char buf[80];

	/* Paranoia. */
	assert(c->ghost);
	if (!rf_has(race->flags, RF_PLAYER_GHOST))
		return false;

	/* Hack -- No easy player ghosts, unless the ghost is from a savefile.
	 * This also makes player ghosts much rarer, and effectively (almost)
	 * prevents more than one from being on a level. From 0.5.1, other code
	 * makes it is formally impossible to have more than one ghost at a time.
	 * -BR- */
	if ((race->level < c->depth - 5) && (from_savefile == false))
		return false;

	/* Store the index of the base race. */
	c->ghost->race = r_idx;

	/* Copy the info from the template to the special "ghost slot", and use
	 * that from here on.  Melee blows have to be deeply copied so those of
	 * the base race are not modified. */
	mem_free(r_info[PLAYER_GHOST_RACE].blow);
	memcpy(&r_info[PLAYER_GHOST_RACE], race, sizeof(*race));
	r_info[PLAYER_GHOST_RACE].blow = mem_alloc(z_info->mon_blows_max
		* sizeof(*r_info[PLAYER_GHOST_RACE].blow));
	for (iblow = 0; iblow < z_info->mon_blows_max; ++iblow) {
		r_info[PLAYER_GHOST_RACE].blow[iblow] = race->blow[iblow];
		r_info[PLAYER_GHOST_RACE].blow[iblow].next =
			(iblow < z_info->mon_blows_max - 1) ?
			r_info[PLAYER_GHOST_RACE].blow + iblow + 1 : NULL;
	}
	race = &r_info[PLAYER_GHOST_RACE];
	mon->race = race;

	/* Set rarity to 0 so the ghost can't rise again */
	race->rarity = 0;

	/* Choose a bones file.  Use the variable bones_selector if it has any
	 * information in it (this allows saved ghosts to reacquire all special
	 * features), then use the current depth, and finally pick at random.
	 *
	 * Note the hackery with bitflags to choose between a genuine player
	 * ghost and a preloaded one, and the chance that a ghost will be
	 * different on reloading on a multiplayer server if someone else has
	 * killed the original one in the mean time. */
	for (try = 0; try < 40; ++try) {
		/* Prepare a path, and store the file number for future reference. */
		if (try == 0) {
			if (!c->ghost->bones_selector) {
				/* Try for an actual ghost of the player's depth first */
				c->ghost->bones_selector = player->depth;
				path_build(path, sizeof(path), ANGBAND_DIR_BONE,
						   format("bone.%03d", c->ghost->bones_selector));
			} else {
				/* Loading a preloaded ghost from savefile */
				if (c->ghost->bones_selector & 0x80) {
					c->ghost->bones_selector &= 0x7F;
					path_build(path, sizeof(path), ANGBAND_DIR_GHOST,
							   format("bone.%03d", c->ghost->bones_selector));
					c->ghost->bones_selector |= 0x80;
				} else {
					/* Loading an actual ghost from savefile */
					path_build(path, sizeof(path), ANGBAND_DIR_BONE,
							   format("bone.%03d", c->ghost->bones_selector));
				}
			}
		} else {
			/* Just pick a random depth if we can't get the player's */
			c->ghost->bones_selector = randint1(z_info->max_depth - 1);

			/* After the first attempt, randomly try preloaded ghosts */
			if (!one_in_(3)) {
				path_build(path, sizeof(path), ANGBAND_DIR_BONE,
						   format("bone.%03d", c->ghost->bones_selector));
			} else {
				path_build(path, sizeof(path), ANGBAND_DIR_GHOST,
						   format("bone.%03d", c->ghost->bones_selector));
				c->ghost->bones_selector |= 0x80;
			}
		}

		/* Check we actually have a path */
		if (strlen(path) == 0) continue;

		/* Attempt to open the bones file. */
		fp = file_open(path, MODE_READ, FTYPE_TEXT);

		/* No bones file with that number, try again. */
		if (!fp) {
			c->ghost->bones_selector = 0;
			continue;
		}

		/* Success. */
		if (fp) break;
	}

	/* No bones file found, so no Ghost is made. */
	if (!fp) return false;

	/* Scan the file */

	/* Name */
	if (!file_getl(fp, buf, sizeof(buf))) return false;
	my_strcpy(c->ghost->name, buf, GHOST_NAME_LENGTH);

	/* Race */
	if (!file_getl(fp, buf, sizeof(buf))) return false;
	if (1 != sscanf(buf, "%d", &ghost_race)) return false;

	/* Class */
	if (!file_getl(fp, buf, sizeof(buf))) return false;
	if (1 != sscanf(buf, "%d", &ghost_class)) return false;

	/* String type (maybe) */
	if (file_getl(fp, buf, sizeof(buf))) {
		if (1 != sscanf(buf, "%d", &c->ghost->string_type))
			c->ghost->string_type = 0;
	}

	/* String (maybe) */
	if (strlen(buf) > 2) {
		my_strcpy(c->ghost->string, buf + 2, strlen(buf));
	} else {
		c->ghost->string_type = 0;
	}

	/* Close the file */
	file_close(fp);

	/* Process the ghost name and store it. */
	for (i = 0; (i < 16) && (c->ghost->name[i]) &&
			 (c->ghost->name[i] != ','); i++);

	/* Terminate the name */
	c->ghost->name[i] = '\0';

	/* Force a name */
	if (!c->ghost->name[0]) {
		my_strcpy(c->ghost->name, "Nobody", strlen(c->ghost->name));
	}

	/* Capitalize the name */
	if (islower(c->ghost->name[0])) {
		c->ghost->name[0] = toupper(c->ghost->name[0]);
	}

	/* Process race and class. */
	p_race = player_id2race(ghost_race);
	class = player_id2class(ghost_class);
	process_ghost_race_class(p_race, class, race);

	/* A little extra help for the deepest ghosts */
	if (c->depth > 75) {
		race->spell_power += 3 * (c->depth - 75) / 2;
	}

	/* Increase the level feeling */
	add_to_monster_rating(c, 10);

	/* Player ghosts are "seen" whenever generated. */
	lore->sights = 1;

	/* Success */
	return true;
}